

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

int32_t utrie_getDataBlock(UNewTrie *trie,UChar32 c)

{
  int32_t iVar1;
  int32_t newBlock;
  int32_t indexValue;
  UChar32 c_local;
  UNewTrie *trie_local;
  
  trie_local._4_4_ = trie->index[c >> 5];
  if (trie_local._4_4_ < 1) {
    iVar1 = utrie_allocDataBlock(trie);
    if (iVar1 < 0) {
      trie_local._4_4_ = -1;
    }
    else {
      trie->index[c >> 5] = iVar1;
      memcpy(trie->data + iVar1,trie->data + -(long)trie_local._4_4_,0x80);
      trie_local._4_4_ = iVar1;
    }
  }
  return trie_local._4_4_;
}

Assistant:

static int32_t
utrie_getDataBlock(UNewTrie *trie, UChar32 c) {
    int32_t indexValue, newBlock;

    c>>=UTRIE_SHIFT;
    indexValue=trie->index[c];
    if(indexValue>0) {
        return indexValue;
    }

    /* allocate a new data block */
    newBlock=utrie_allocDataBlock(trie);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    trie->index[c]=newBlock;

    /* copy-on-write for a block from a setRange() */
    uprv_memcpy(trie->data+newBlock, trie->data-indexValue, 4*UTRIE_DATA_BLOCK_LENGTH);
    return newBlock;
}